

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleaction.hh
# Opt level: O0

int __thiscall
RuleAndDistribute::clone
          (RuleAndDistribute *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  string *psVar2;
  ActionGroupList *grouplist_local;
  RuleAndDistribute *this_local;
  
  psVar2 = Rule::getGroup_abi_cxx11_(&this->super_Rule);
  bVar1 = ActionGroupList::contains((ActionGroupList *)__fn,psVar2);
  if (bVar1) {
    this_local = (RuleAndDistribute *)operator_new(0x58);
    psVar2 = Rule::getGroup_abi_cxx11_(&this->super_Rule);
    RuleAndDistribute(this_local,psVar2);
  }
  else {
    this_local = (RuleAndDistribute *)0x0;
  }
  return (int)this_local;
}

Assistant:

virtual Rule *clone(const ActionGroupList &grouplist) const {
    if (!grouplist.contains(getGroup())) return (Rule *)0;
    return new RuleAndDistribute(getGroup());
  }